

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O0

void perfetto::ipc::HostImpl::SendFrame(ClientConnection *client,Frame *frame,int fd)

{
  uint uVar1;
  code *pcVar2;
  bool bVar3;
  pointer pUVar4;
  void *msg;
  size_t len;
  char *fname;
  uint *puVar5;
  int *piVar6;
  char *pcVar7;
  Frame *frame_00;
  byte local_71;
  bool res;
  undefined1 local_48 [8];
  string buf;
  ScopedClear scoped_key;
  uid_t peer_uid;
  int fd_local;
  Frame *frame_local;
  ClientConnection *client_local;
  
  pUVar4 = std::
           unique_ptr<perfetto::base::UnixSocket,_std::default_delete<perfetto::base::UnixSocket>_>
           ::get(&client->sock);
  anon_unknown_0::GetPosixPeerUid(pUVar4);
  perfetto::base::CrashKey::SetScoped((CrashKey *)((long)&buf.field_2 + 8),0x9f9f58);
  BufferedFrameDeserializer::Serialize_abi_cxx11_
            ((string *)local_48,(BufferedFrameDeserializer *)frame,frame_00);
  pUVar4 = std::
           unique_ptr<perfetto::base::UnixSocket,_std::default_delete<perfetto::base::UnixSocket>_>
           ::operator->(&client->sock);
  msg = (void *)::std::__cxx11::string::data();
  len = ::std::__cxx11::string::size();
  bVar3 = perfetto::base::UnixSocket::Send(pUVar4,msg,len,fd);
  local_71 = 1;
  if (!bVar3) {
    pUVar4 = std::
             unique_ptr<perfetto::base::UnixSocket,_std::default_delete<perfetto::base::UnixSocket>_>
             ::operator->(&client->sock);
    bVar3 = perfetto::base::UnixSocket::is_connected(pUVar4);
    local_71 = bVar3 ^ 0xff;
  }
  if (((local_71 ^ 0xff) & 1) == 0) {
    ::std::__cxx11::string::~string((string *)local_48);
    perfetto::base::CrashKey::ScopedClear::~ScopedClear((ScopedClear *)((long)&buf.field_2 + 8));
    return;
  }
  fname = perfetto::base::Basename
                    (
                    "/workspace/llm4binary/github/license_c_cmakelists/kokkos[P]kokkos-tools/profiling/perfetto-connector/perfetto/perfetto.cc"
                    );
  puVar5 = (uint *)__errno_location();
  uVar1 = *puVar5;
  piVar6 = __errno_location();
  pcVar7 = strerror(*piVar6);
  perfetto::base::LogMessage
            (kLogError,fname,0x112d9,"%s (errno: %d, %s)",
             "PERFETTO_CHECK(res || !client->sock->is_connected())",(ulong)uVar1,pcVar7);
  perfetto::base::MaybeSerializeLastLogsForCrashReporting();
  pcVar2 = (code *)invalidInstructionException();
  (*pcVar2)();
}

Assistant:

void HostImpl::SendFrame(ClientConnection* client, const Frame& frame, int fd) {
  auto peer_uid = GetPosixPeerUid(client->sock.get());
  auto scoped_key = g_crash_key_uid.SetScoped(static_cast<int64_t>(peer_uid));

  std::string buf = BufferedFrameDeserializer::Serialize(frame);

  // When a new Client connects in OnNewClientConnection we set a timeout on
  // Send (see call to SetTxTimeout).
  //
  // The old behaviour was to do a blocking I/O call, which caused crashes from
  // misbehaving producers (see b/169051440).
  bool res = client->sock->Send(buf.data(), buf.size(), fd);
  // If we timeout |res| will be false, but the UnixSocket will have called
  // UnixSocket::ShutDown() and thus |is_connected()| is false.
  PERFETTO_CHECK(res || !client->sock->is_connected());
}